

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  uint dim;
  
  GA::Initialize(argc,argv,200000,200000,0x3f4,0);
  iVar1 = GA_Nodeid();
  iVar2 = GA_Nnodes();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rank = ",7);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," : Size = ",10);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"After Initialize()\n",0x13);
  iVar2 = 0;
  do {
    dim = 1;
    do {
      if (iVar1 == 0) {
        printf("\n\ndim =%d\n\n",(ulong)dim);
        printf("data type: int\t\t");
        test_fun(0x3e9,dim,iVar2);
        printf("data type: double\t");
      }
      else {
        test_fun(0x3e9,dim,iVar2);
      }
      test_fun(0x3ec,dim,iVar2);
      if (iVar1 == 0) {
        printf("data type: float\t");
        test_fun(0x3eb,dim,iVar2);
        printf("data type: long\t\t");
      }
      else {
        test_fun(0x3eb,dim,iVar2);
      }
      test_fun(0x3ea,dim,iVar2);
      if (iVar1 == 0) {
        printf("data type: complex\t");
      }
      test_fun(0x3ef,dim,iVar2);
      dim = dim + 1;
    } while (dim != 4);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 7);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Terminating\n",0xc);
  }
  GA::Terminate();
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
 
  int me, nproc;
  int heap  = 200000, stack = 200000;
  int d, op, ok = 1;

  GA::Initialize(argc, argv, heap, stack, GA_DATA_TYPE, 0);
  me=GA_Nodeid(); nproc=GA_Nnodes();
  cout << "Rank = " << me << " : Size = " << nproc << "\n";

  cout << "After Initialize()\n";
  
  for (op = 0; op < 7; op++) {
    for (d = 1; d < 4; d++) {
      if (me == 0)  printf ("\n\ndim =%d\n\n", d);
  
      if (me == 0)  printf ("data type: int\t\t");
      ok = test_fun (C_INT, d, op);
      
      if (me == 0)  printf ("data type: double\t");
      ok = test_fun (C_DBL, d, op);
      
      if (me == 0)  printf ("data type: float\t");
      ok = test_fun (C_FLOAT, d, op);
      
      if (me == 0)  printf ("data type: long\t\t");
      ok = test_fun (C_LONG, d, op);
      
      if (me == 0)  printf ("data type: complex\t");
      test_fun (C_DCPL, d, op);
    }
  }
  
  if(!me) cout << "Terminating\n";
  GA::Terminate();
}